

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O0

void __thiscall
TimedMutexTest_TryLockForTimeout_Test<yamc::posix::rwlock>::TestBody
          (TimedMutexTest_TryLockForTimeout_Test<yamc::posix::rwlock> *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_178;
  Message local_170;
  duration<long,_std::ratio<1L,_1000000L>_> local_168;
  int local_15c;
  duration<long,_std::ratio<1L,_1000L>_> local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar;
  AssertHelper local_120;
  Message local_118;
  int local_10c;
  duration<long,_std::ratio<1L,_1000L>_> local_108;
  bool local_f9;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_;
  stopwatch<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
  sw;
  type local_d0;
  join_thread local_c0;
  join_thread thd;
  undefined1 local_80 [8];
  barrier step;
  TimedMutexTest_TryLockForTimeout_Test<yamc::posix::rwlock> *this_local;
  
  step.mtx_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)this;
  yamc::test::barrier::barrier((barrier *)local_80,2);
  yamc::posix::rwlock::rwlock((rwlock *)&thd);
  local_d0.mtx = (TypeParam *)&thd;
  local_d0.step = (barrier *)local_80;
  yamc::test::join_thread::
  join_thread<TimedMutexTest_TryLockForTimeout_Test<yamc::posix::rwlock>::TestBody()::_lambda()_1_>
            (&local_c0,&local_d0);
  yamc::test::barrier::await((barrier *)local_80);
  yamc::test::
  stopwatch<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
  ::stopwatch((stopwatch<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
               *)&gtest_ar_.message_);
  local_10c = 300;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_108,&local_10c);
  bVar1 = yamc::posix::rwlock::try_lock_for<long,std::ratio<1l,1000l>>((rwlock *)&thd,&local_108);
  local_f9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f8,&local_f9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_f8,
               (AssertionResult *)"mtx.try_lock_for(std::chrono::milliseconds(300))","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/basic_test.cpp"
               ,0x135,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  local_15c = 300;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_158,&local_15c);
  local_168 = yamc::test::
              stopwatch<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
              ::elapsed((stopwatch<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
                         *)&gtest_ar_.message_);
  testing::internal::
  CmpHelperLE<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>>
            ((internal *)local_150,"std::chrono::milliseconds(300)","sw.elapsed()",&local_158,
             &local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/basic_test.cpp"
               ,0x136,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  yamc::test::barrier::await((barrier *)local_80);
  yamc::test::join_thread::~join_thread(&local_c0);
  yamc::posix::rwlock::~rwlock((rwlock *)&thd);
  yamc::test::barrier::~barrier((barrier *)local_80);
  return;
}

Assistant:

TYPED_TEST(TimedMutexTest, TryLockForTimeout)
{
  yamc::test::barrier step(2);
  TypeParam mtx;
  yamc::test::join_thread thd([&]{
    ASSERT_NO_THROW(mtx.lock());
    step.await();  // b1
    step.await();  // b2
    ASSERT_NO_THROW(mtx.unlock());
  });
  {
    step.await();  // b1
    yamc::test::stopwatch<std::chrono::steady_clock> sw;
    EXPECT_FALSE(mtx.try_lock_for(TEST_EXPECT_TIMEOUT));
    EXPECT_LE(TEST_EXPECT_TIMEOUT, sw.elapsed());
    step.await();  // b2
  }
}